

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O2

bool __thiscall
cmTargetPropCommandBase::ProcessContentArgs
          (cmTargetPropCommandBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,uint *argIndex,bool prepend,bool system)

{
  pointer pbVar1;
  bool bVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000081;
  uint uVar3;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  content;
  string scope;
  allocator local_81;
  undefined4 local_80;
  undefined4 local_7c;
  string local_78;
  cmTargetPropCommandBase *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string
            ((string *)&local_50,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + *argIndex));
  bVar2 = std::operator!=(&local_50,"PUBLIC");
  if (bVar2) {
    bVar2 = std::operator!=(&local_50,"PRIVATE");
    if (!bVar2) goto LAB_0036d3b5;
    bVar2 = std::operator!=(&local_50,"INTERFACE");
    if (!bVar2) goto LAB_0036d3b5;
    std::__cxx11::string::string((string *)&local_78,"called with invalid arguments",&local_81);
    cmCommand::SetError(&this->super_cmCommand,&local_78);
LAB_0036d411:
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
LAB_0036d3b5:
    if (this->Target->IsImportedTarget != true) {
      if (this->Target->TargetTypeValue == INTERFACE_LIBRARY) {
        bVar2 = std::operator!=(&local_50,"INTERFACE");
        if (bVar2) {
          std::__cxx11::string::string
                    ((string *)&local_78,"may only be set INTERFACE properties on INTERFACE targets"
                     ,&local_81);
          cmCommand::SetError(&this->super_cmCommand,&local_78);
          goto LAB_0036d411;
        }
      }
      local_80 = (undefined4)CONCAT71(in_register_00000009,prepend);
      local_7c = (undefined4)CONCAT71(in_register_00000081,system);
      uVar3 = *argIndex + 1;
      *argIndex = uVar3;
      local_78.field_2._M_allocated_capacity = 0;
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      local_58 = this;
      while( true ) {
        uVar4 = (ulong)uVar3;
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar4)
        break;
        bVar2 = std::operator==(pbVar1 + uVar4,"PUBLIC");
        if (bVar2) {
LAB_0036d4c3:
          bVar2 = PopulateTargetProperies
                            (local_58,&local_50,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&local_78,local_80._0_1_,local_7c._0_1_);
          goto LAB_0036d503;
        }
        bVar2 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar4,"PRIVATE");
        if (bVar2) goto LAB_0036d4c3;
        bVar2 = std::operator==((args->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar4,"INTERFACE");
        if (bVar2) goto LAB_0036d4c3;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_78,
                    (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar4);
        uVar3 = uVar3 + 1;
        *argIndex = *argIndex + 1;
      }
      bVar2 = PopulateTargetProperies
                        (local_58,&local_50,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_78,local_80._0_1_,local_7c._0_1_);
LAB_0036d503:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_78);
      goto LAB_0036d50f;
    }
    (*(this->super_cmCommand).super_cmObject._vptr_cmObject[0xd])
              (this,(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  }
  bVar2 = false;
LAB_0036d50f:
  std::__cxx11::string::~string((string *)&local_50);
  return bVar2;
}

Assistant:

bool cmTargetPropCommandBase
::ProcessContentArgs(std::vector<std::string> const& args,
                     unsigned int &argIndex, bool prepend, bool system)
{
  const std::string scope = args[argIndex];

  if(scope != "PUBLIC"
      && scope != "PRIVATE"
      && scope != "INTERFACE" )
    {
    this->SetError("called with invalid arguments");
    return false;
    }

  if(this->Target->IsImported())
    {
    this->HandleImportedTarget(args[0]);
    return false;
    }

  if (this->Target->GetType() == cmState::INTERFACE_LIBRARY
      && scope != "INTERFACE")
    {
    this->SetError("may only be set INTERFACE properties on INTERFACE "
      "targets");
    return false;
    }

  ++argIndex;

  std::vector<std::string> content;

  for(unsigned int i=argIndex; i < args.size(); ++i, ++argIndex)
    {
    if(args[i] == "PUBLIC"
        || args[i] == "PRIVATE"
        || args[i] == "INTERFACE" )
      {
      return this->PopulateTargetProperies(scope, content, prepend, system);
      }
    content.push_back(args[i]);
    }
  return this->PopulateTargetProperies(scope, content, prepend, system);
}